

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tran_test.c
# Opt level: O3

void test_udp_multi_small_burst(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  int i;
  int iVar4;
  undefined1 local_178 [8];
  char msg [256];
  udp_recv_count rc;
  size_t local_48;
  size_t sz;
  float local_38;
  nng_listener local_34;
  nng_dialer local_30;
  nng_listener l;
  nng_dialer d;
  nng_socket s0;
  nng_socket s1;
  
  msg[0xf8] = '\0';
  msg[0xf9] = '\0';
  msg[0xfa] = '\0';
  msg[0xfb] = '\0';
  msg[0xfc] = '\0';
  msg[0xfd] = '\0';
  msg[0xfe] = '\0';
  msg[0xff] = '\0';
  nuts_set_logger(5);
  nuts_scratch_addr("udp",0x40,test_udp_multi_small_burst::nuts_addr_);
  nVar1 = nng_aio_alloc((nng_aio **)(msg + 0xf8),udp_recv_count_cb,msg + 0xf8);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0x141,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&rc.aio, udp_recv_count_cb, &rc)",pcVar3,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open((nng_socket *)&l);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                           ,0x143,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3
                           ,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_ms((nng_socket)l.id,"recv-timeout",10);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                             ,0x144,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 10)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms((nng_socket)l.id,"send-timeout",1000);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                               ,0x145,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_listener_create(&local_34,(nng_socket)l.id,
                                      test_udp_multi_small_burst::nuts_addr_);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                 ,0x146,"%s: expected success, got %s (%d)",
                                 "nng_listener_create(&l, s0, addr)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_listener_set_size(local_34,"udp:copy-max",100);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                   ,0x147,"%s: expected success, got %s (%d)",
                                   "nng_listener_set_size(l, NNG_OPT_UDP_COPY_MAX, 100)",pcVar3,
                                   nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_listener_get_size(local_34,"udp:copy-max",&local_48);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                     ,0x148,"%s: expected success, got %s (%d)",
                                     "nng_listener_get_size(l, NNG_OPT_UDP_COPY_MAX, &sz)",pcVar3,
                                     nVar1);
              if (iVar2 != 0) {
                acutest_check_((uint)(local_48 == 100),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                               ,0x149,"%s","sz == 100");
                nVar1 = nng_listener_start(local_34,0);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                       ,0x14a,"%s: expected success, got %s (%d)",
                                       "nng_listener_start(l, 0)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_pair1_open((nng_socket *)&d);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                         ,0x14c,"%s: expected success, got %s (%d)",
                                         "nng_pair1_open(&(s1))",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_socket_set_ms((nng_socket)d.id,"recv-timeout",10);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                           ,0x14d,"%s: expected success, got %s (%d)",
                                           "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 10)",pcVar3,
                                           nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_socket_set_ms((nng_socket)d.id,"send-timeout",1000);
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                             ,0x14e,"%s: expected success, got %s (%d)",
                                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000)",pcVar3
                                             ,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_dialer_create(&local_30,(nng_socket)d.id,
                                                  test_udp_multi_small_burst::nuts_addr_);
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                               ,0x14f,"%s: expected success, got %s (%d)",
                                               "nng_dialer_create(&d, s1, addr)",pcVar3,nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_dialer_set_size(local_30,"udp:copy-max",100);
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                                 ,0x150,"%s: expected success, got %s (%d)",
                                                 "nng_dialer_set_size(d, NNG_OPT_UDP_COPY_MAX, 100)"
                                                 ,pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nVar1 = nng_dialer_get_size(local_30,"udp:copy-max",&local_48);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                                  ,0x151,"%s: expected success, got %s (%d)",
                                                  "nng_dialer_get_size(d, NNG_OPT_UDP_COPY_MAX, &sz)"
                                                  ,pcVar3,nVar1);
                            if (iVar2 != 0) {
                              nVar1 = nng_dialer_start(local_30,0);
                              pcVar3 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                                  ,0x152,"%s: expected success, got %s (%d)",
                                                  "nng_dialer_start(d, 0)",pcVar3,nVar1);
                              if (iVar2 != 0) {
                                nng_msleep(100);
                                pcVar3 = getenv("NNG_UDP_PASS_RATE");
                                if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
                                  nng_log_notice("UDP","required pass rate %0.02f",0);
                                  nng_log_notice((char *)0x0,
                                                 "To change pass rate, set $NNG_UDP_PASS_RATE to percentage of packets that must be received."
                                                );
                                  local_38 = 0.5;
                                }
                                else {
                                  iVar2 = atoi(pcVar3);
                                  local_38 = (float)iVar2 / 100.0;
                                  nng_log_notice("UDP","required pass rate changed to %0.02f",
                                                 SUB84((double)local_38,0));
                                }
                                nng_socket_recv((nng_socket)l.id,(nng_aio *)msg._248_8_);
                                iVar2 = 0;
                                s0.id = 0;
                                do {
                                  iVar4 = 0x14;
                                  do {
                                    nng_send((nng_socket)d.id,local_178,0x5f,0);
                                    s0.id = (uint32_t)(s0.id + 1.0);
                                    iVar4 = iVar4 + -1;
                                  } while (iVar4 != 0);
                                  nng_msleep(0x14);
                                  iVar2 = iVar2 + 1;
                                } while (iVar2 != 0x28);
                                nng_msleep(10);
                                nng_aio_stop((nng_aio *)msg._248_8_);
                                nng_aio_free((nng_aio *)msg._248_8_);
                                sz._4_4_ = 0.0;
                                acutest_check_((uint)(0.0 <= (float)s0.id),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                               ,0x185,"%s","actual <= expect");
                                sz._0_4_ = sz._4_4_ / (float)s0.id;
                                acutest_check_((uint)(local_38 < (float)sz),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                               ,0x186,"%s","actual / expect > require");
                                nng_log_notice("UDP","Packet loss: %.02f (got %.f of %.f)",
                                               SUB84(1.0 - (double)(float)sz,0),(double)sz._4_4_,
                                               (double)(float)s0.id);
                                nVar1 = nng_socket_close((nng_socket)l.id);
                                pcVar3 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                                  ,0x189,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s0)",pcVar3,nVar1);
                                if (iVar2 != 0) {
                                  nVar1 = nng_socket_close((nng_socket)d.id);
                                  pcVar3 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                                                  ,0x18a,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s1)",pcVar3,nVar1);
                                  if (iVar2 != 0) {
                                    return;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_udp_multi_small_burst(void)
{
	char           msg[256];
	nng_socket     s0;
	nng_socket     s1;
	nng_listener   l;
	nng_dialer     d;
	size_t         sz;
	char          *addr;
	udp_recv_count rc = { 0 };

	NUTS_ENABLE_LOG(NNG_LOG_NOTICE);
	NUTS_ADDR(addr, "udp");

	NUTS_PASS(nng_aio_alloc(&rc.aio, udp_recv_count_cb, &rc));

	NUTS_OPEN(s0);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 10));
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_listener_create(&l, s0, addr));
	NUTS_PASS(nng_listener_set_size(l, NNG_OPT_UDP_COPY_MAX, 100));
	NUTS_PASS(nng_listener_get_size(l, NNG_OPT_UDP_COPY_MAX, &sz));
	NUTS_TRUE(sz == 100);
	NUTS_PASS(nng_listener_start(l, 0));

	NUTS_OPEN(s1);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 10));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_dialer_create(&d, s1, addr));
	NUTS_PASS(nng_dialer_set_size(d, NNG_OPT_UDP_COPY_MAX, 100));
	NUTS_PASS(nng_dialer_get_size(d, NNG_OPT_UDP_COPY_MAX, &sz));
	NUTS_PASS(nng_dialer_start(d, 0));
	nng_msleep(100);

	float actual  = 0;
	float expect  = 0;
	float require = 0.50;
	int   burst   = 20;
	int   count   = 40;
#if defined(NNG_PLATFORM_WINDOWS)
	// Windows seems to drop a lot - maybe because of virtualization
	burst   = 2;
	count   = 10;
	require = 0.10;
#endif

	const char *pass_rate = getenv("NNG_UDP_PASS_RATE");
	if (pass_rate != NULL && strlen(pass_rate) > 0) {
		require = (atoi(pass_rate) * 1.0) / 100.0;
		nng_log_notice(
		    "UDP", "required pass rate changed to %0.02f", require);
	} else {
		nng_log_notice("UDP", "required pass rate %0.02f", require);
		nng_log_notice(NULL,
		    "To change pass rate, set $NNG_UDP_PASS_RATE to "
		    "percentage of packets that must be received.");
	}

#if defined(NNG_SANITIZER) || defined(NNG_COVERAGE)
	// sanitizers may drop a lot, so can coverage
	require = 0.0;
#endif

	rc.sock   = s0;
	rc.len    = 95;
	rc.expect = msg;

	nng_socket_recv(rc.sock, rc.aio);

	// Experimentally at least on Darwin, we see some packet losses
	// even for loopback.  Loss rates appear depressingly high.
	for (int i = 0; i < count; i++) {
		for (int j = 0; j < burst; j++) {
			(void) nng_send(s1, msg, 95, 0);
			expect++;
		}
		nng_msleep(20);
	}
	nng_msleep(10);
	nng_aio_stop(rc.aio);
	nng_aio_free(rc.aio);
	actual = rc.pass;
	NUTS_TRUE(actual <= expect);
	NUTS_TRUE(actual / expect > require);
	nng_log_notice("UDP", "Packet loss: %.02f (got %.f of %.f)",
	    1.0 - actual / expect, actual, expect);
	NUTS_CLOSE(s0);
	NUTS_CLOSE(s1);
}